

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

char * __thiscall Json::Value::asCString(Value *this)

{
  uint *in_RDI;
  char *this_str;
  uint this_len;
  ostringstream oss;
  char **in_stack_fffffffffffffe28;
  ostringstream *this_00;
  char *in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  string local_1b8 [48];
  ostringstream local_188 [384];
  char *local_8;
  
  if ((in_RDI[2] & 0xff) != 4) {
    this_00 = local_188;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"in Json::Value::asCString(): requires stringValue");
    std::__cxx11::ostringstream::str();
    throwLogicError((string *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
    std::__cxx11::string::~string(local_1b8);
    abort();
  }
  if (*(long *)in_RDI == 0) {
    local_8 = (char *)0x0;
  }
  else {
    decodePrefixedString
              ((bool)in_stack_fffffffffffffe47,in_stack_fffffffffffffe38,in_RDI,
               in_stack_fffffffffffffe28);
    local_8 = in_stack_fffffffffffffe38;
  }
  return local_8;
}

Assistant:

const char* Value::asCString() const {
  JSON_ASSERT_MESSAGE(type_ == stringValue,
                      "in Json::Value::asCString(): requires stringValue");
  if (value_.string_ == 0) return 0;
  unsigned this_len;
  char const* this_str;
  decodePrefixedString(this->allocated_, this->value_.string_, &this_len, &this_str);
  return this_str;
}